

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::StructBuilderBody
          (PythonGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr,
          size_t index,bool in_array)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDef *field;
  StructDef *pSVar2;
  char *pcVar3;
  BaseType BVar4;
  undefined8 *puVar5;
  pointer ppFVar6;
  undefined8 uVar7;
  undefined8 extraout_RAX;
  long *plVar8;
  size_type *psVar9;
  BaseType BVar10;
  ulong *puVar11;
  undefined7 in_register_00000089;
  unsigned_long t;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> index_var;
  string indent;
  string local_138;
  ulong *local_118;
  long local_110;
  ulong local_108;
  undefined8 uStack_100;
  string local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  uint local_b4;
  PythonGenerator *local_b0;
  StructDef *local_a8;
  size_t local_a0;
  IdlNamer *local_98;
  char *local_90;
  long *local_88;
  long local_80;
  long local_78 [2];
  string local_68;
  size_t local_48;
  StructDef *local_40;
  pointer local_38;
  
  local_b4 = (uint)CONCAT71(in_register_00000089,in_array);
  local_88 = local_78;
  local_b0 = this;
  local_a8 = struct_def;
  local_a0 = index;
  local_90 = nameprefix;
  std::__cxx11::string::_M_construct((ulong)&local_88,(char)index * '\x04');
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char*>((string *)&local_118,local_88,local_80 + (long)local_88)
  ;
  std::__cxx11::string::append((char *)&local_118);
  NumToString<unsigned_long>(&local_f8,local_a8->minalign);
  uVar12 = 0xf;
  if (local_118 != &local_108) {
    uVar12 = local_108;
  }
  if (uVar12 < local_f8._M_string_length + local_110) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar7 = local_f8.field_2._M_allocated_capacity;
    }
    if (local_f8._M_string_length + local_110 <= (ulong)uVar7) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_118);
      goto LAB_00282588;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_f8._M_dataplus._M_p);
LAB_00282588:
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar9 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_138.field_2._M_allocated_capacity = *psVar9;
    local_138.field_2._8_8_ = puVar5[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar9;
    local_138._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_138._M_string_length = puVar5[1];
  *puVar5 = psVar9;
  puVar5[1] = 0;
  *(undefined1 *)psVar9 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
  puVar11 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar11) {
    local_c8 = *puVar11;
    lStack_c0 = puVar5[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar11;
    local_d8 = (ulong *)*puVar5;
  }
  local_d0 = puVar5[1];
  *puVar5 = puVar11;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d8);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  paVar1 = &local_138.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  NumToString<unsigned_long>(&local_138,local_a8->bytesize);
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
  puVar11 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar11) {
    local_c8 = *puVar11;
    lStack_c0 = puVar5[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar11;
    local_d8 = (ulong *)*puVar5;
  }
  local_d0 = puVar5[1];
  *puVar5 = puVar11;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d8);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  ppFVar6 = (local_a8->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar6 !=
      (local_a8->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_98 = &local_b0->namer_;
    local_48 = local_a0 + 1;
    do {
      field = ppFVar6[-1];
      BVar4 = (field->value).type.base_type;
      BVar10 = BVar4;
      if (BVar4 == BASE_TYPE_ARRAY) {
        BVar10 = (field->value).type.element;
      }
      local_40 = (field->value).type.struct_def;
      local_38 = ppFVar6;
      if (field->padding != 0) {
        local_118 = &local_108;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,local_88,local_80 + (long)local_88);
        std::__cxx11::string::append((char *)&local_118);
        NumToString<unsigned_long>(&local_f8,field->padding);
        uVar12 = 0xf;
        if (local_118 != &local_108) {
          uVar12 = local_108;
        }
        if (uVar12 < local_f8._M_string_length + local_110) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar7 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_f8._M_string_length + local_110) goto LAB_00282864;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_118);
        }
        else {
LAB_00282864:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_118,(ulong)local_f8._M_dataplus._M_p);
        }
        psVar9 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_138.field_2._M_allocated_capacity = *psVar9;
          local_138.field_2._8_8_ = puVar5[3];
          local_138._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar9;
          local_138._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_138._M_string_length = puVar5[1];
        *puVar5 = psVar9;
        puVar5[1] = 0;
        *(undefined1 *)psVar9 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
        local_d8 = &local_c8;
        puVar11 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar11) {
          local_c8 = *puVar11;
          lStack_c0 = puVar5[3];
        }
        else {
          local_c8 = *puVar11;
          local_d8 = (ulong *)*puVar5;
        }
        local_d0 = puVar5[1];
        *puVar5 = puVar11;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d8);
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        BVar4 = (field->value).type.base_type;
      }
      if ((BVar4 == BASE_TYPE_STRUCT) &&
         (pSVar2 = (field->value).type.struct_def, pSVar2->fixed == true)) {
        (*(local_98->super_Namer)._vptr_Namer[0x12])(&local_118,local_98,field);
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
        pcVar3 = local_90;
        psVar9 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_138.field_2._M_allocated_capacity = *psVar9;
          local_138.field_2._8_8_ = puVar5[3];
          local_138._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar9;
          local_138._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_138._M_string_length = puVar5[1];
        *puVar5 = psVar9;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        strlen(local_90);
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_138,0,(char *)0x0,(ulong)pcVar3);
        local_d8 = &local_c8;
        puVar11 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar11) {
          local_c8 = *puVar11;
          lStack_c0 = plVar8[3];
        }
        else {
          local_c8 = *puVar11;
          local_d8 = (ulong *)*plVar8;
        }
        local_d0 = plVar8[1];
        *plVar8 = (long)puVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        StructBuilderBody(local_b0,pSVar2,(char *)local_d8,code_ptr,local_a0,
                          (bool)((byte)local_b4 & 1));
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        uVar12 = local_108;
        puVar11 = local_118;
        if (local_118 != &local_108) {
LAB_002831ce:
          operator_delete(puVar11,uVar12 + 1);
        }
      }
      else {
        NumToString<unsigned_long>(&local_138,local_a0);
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x36d984);
        local_d8 = &local_c8;
        puVar11 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar11) {
          local_c8 = *puVar11;
          lStack_c0 = puVar5[3];
        }
        else {
          local_c8 = *puVar11;
          local_d8 = (ulong *)*puVar5;
        }
        local_d0 = puVar5[1];
        *puVar5 = puVar11;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((field->value).type.base_type == BASE_TYPE_ARRAY) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_88,local_80 + (long)local_88);
          std::__cxx11::string::append((char *)&local_f8);
          puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8);
          local_118 = &local_108;
          puVar11 = puVar5 + 2;
          if ((ulong *)*puVar5 == puVar11) {
            local_108 = *puVar11;
            uStack_100 = puVar5[3];
          }
          else {
            local_108 = *puVar11;
            local_118 = (ulong *)*puVar5;
          }
          local_110 = puVar5[1];
          *puVar5 = puVar11;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          psVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_138.field_2._M_allocated_capacity = *psVar9;
            local_138.field_2._8_8_ = puVar5[3];
            local_138._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar9;
            local_138._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_138._M_string_length = puVar5[1];
          *puVar5 = psVar9;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar1) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          NumToString<unsigned_short>(&local_138,(field->value).type.fixed_length);
          uVar7 = std::__cxx11::string::_M_append
                            ((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar1) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
            uVar7 = extraout_RAX;
          }
          local_b4 = (uint)CONCAT71((int7)((ulong)uVar7 >> 8),1);
          std::__cxx11::string::append((char *)code_ptr);
        }
        if ((BVar10 == BASE_TYPE_STRUCT) && (local_40->fixed == true)) {
          pSVar2 = (field->value).type.struct_def;
          (*(local_98->super_Namer)._vptr_Namer[0x12])(&local_f8,local_98,field);
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
          pcVar3 = local_90;
          local_118 = &local_108;
          puVar11 = puVar5 + 2;
          if ((ulong *)*puVar5 == puVar11) {
            local_108 = *puVar11;
            uStack_100 = puVar5[3];
          }
          else {
            local_108 = *puVar11;
            local_118 = (ulong *)*puVar5;
          }
          local_110 = puVar5[1];
          *puVar5 = puVar11;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          strlen(local_90);
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_118,0,(char *)0x0,(ulong)pcVar3);
          psVar9 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_138.field_2._M_allocated_capacity = *psVar9;
            local_138.field_2._8_8_ = plVar8[3];
            local_138._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar9;
            local_138._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_138._M_string_length = plVar8[1];
          *plVar8 = (long)psVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          StructBuilderBody(local_b0,pSVar2,local_138._M_dataplus._M_p,code_ptr,local_48,
                            (bool)((byte)local_b4 & 1));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar1) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)code_ptr);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_88,local_80 + (long)local_88);
          std::__cxx11::string::append((char *)&local_f8);
          GenMethod_abi_cxx11_(&local_68,local_b0,field);
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar7 = local_f8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_68._M_string_length + local_f8._M_string_length) {
            uVar7 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              uVar7 = local_68.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar7 < local_68._M_string_length + local_f8._M_string_length)
            goto LAB_00282d58;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_68,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
          }
          else {
LAB_00282d58:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)local_68._M_dataplus._M_p);
          }
          local_118 = &local_108;
          puVar11 = puVar5 + 2;
          if ((ulong *)*puVar5 == puVar11) {
            local_108 = *puVar11;
            uStack_100 = puVar5[3];
          }
          else {
            local_108 = *puVar11;
            local_118 = (ulong *)*puVar5;
          }
          local_110 = puVar5[1];
          *puVar5 = puVar11;
          puVar5[1] = 0;
          *(undefined1 *)puVar11 = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
          psVar9 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_138.field_2._M_allocated_capacity = *psVar9;
            local_138.field_2._8_8_ = plVar8[3];
            local_138._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar9;
            local_138._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_138._M_string_length = plVar8[1];
          *plVar8 = (long)psVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar1) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          (*(local_98->super_Namer)._vptr_Namer[7])(&local_118,local_98,field);
          pcVar3 = local_90;
          strlen(local_90);
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)pcVar3);
          psVar9 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_138.field_2._M_allocated_capacity = *psVar9;
            local_138.field_2._8_8_ = puVar5[3];
            local_138._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_138.field_2._M_allocated_capacity = *psVar9;
            local_138._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_138._M_string_length = puVar5[1];
          *puVar5 = psVar9;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar1) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118,local_108 + 1);
          }
          if (((local_b4 & 1) != 0) &&
             (uVar12 = ((field->value).type.base_type == BASE_TYPE_ARRAY) + local_a0, uVar12 != 0))
          {
            t = 0;
            do {
              NumToString<unsigned_long>(&local_f8,t);
              puVar5 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x36d983);
              local_118 = &local_108;
              puVar11 = puVar5 + 2;
              if ((ulong *)*puVar5 == puVar11) {
                local_108 = *puVar11;
                uStack_100 = puVar5[3];
              }
              else {
                local_108 = *puVar11;
                local_118 = (ulong *)*puVar5;
              }
              local_110 = puVar5[1];
              *puVar5 = puVar11;
              puVar5[1] = 0;
              *(undefined1 *)(puVar5 + 2) = 0;
              puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
              psVar9 = puVar5 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_138.field_2._M_allocated_capacity = *psVar9;
                local_138.field_2._8_8_ = puVar5[3];
                local_138._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_138.field_2._M_allocated_capacity = *psVar9;
                local_138._M_dataplus._M_p = (pointer)*puVar5;
              }
              local_138._M_string_length = puVar5[1];
              *puVar5 = psVar9;
              puVar5[1] = 0;
              *(undefined1 *)(puVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_138._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != paVar1) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if (local_118 != &local_108) {
                operator_delete(local_118,local_108 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              t = t + 1;
            } while (t < uVar12);
          }
          std::__cxx11::string::append((char *)code_ptr);
        }
        uVar12 = local_c8;
        puVar11 = local_d8;
        if (local_d8 != &local_c8) goto LAB_002831ce;
      }
      ppFVar6 = local_38 + -1;
    } while (ppFVar6 !=
             (local_a8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return;
}

Assistant:

void StructBuilderBody(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr, size_t index = 0,
                         bool in_array = false) const {
    auto &code = *code_ptr;
    std::string indent(index * 4, ' ');
    code +=
        indent + "    builder.Prep(" + NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ")\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto &type =
          IsArray(field_type) ? field_type.VectorType() : field_type;
      if (field.padding)
        code +=
            indent + "    builder.Pad(" + NumToString(field.padding) + ")\n";
      if (IsStruct(field_type)) {
        StructBuilderBody(*field_type.struct_def,
                          (nameprefix + (namer_.Field(field) + "_")).c_str(),
                          code_ptr, index, in_array);
      } else {
        const auto index_var = "_idx" + NumToString(index);
        if (IsArray(field_type)) {
          code += indent + "    for " + index_var + " in range(";
          code += NumToString(field_type.fixed_length);
          code += " , 0, -1):\n";
          in_array = true;
        }
        if (IsStruct(type)) {
          StructBuilderBody(*field_type.struct_def,
                            (nameprefix + (namer_.Field(field) + "_")).c_str(),
                            code_ptr, index + 1, in_array);
        } else {
          code += IsArray(field_type) ? "    " : "";
          code += indent + "    builder.Prepend" + GenMethod(field) + "(";
          code += nameprefix + namer_.Variable(field);
          size_t array_cnt = index + (IsArray(field_type) ? 1 : 0);
          for (size_t i = 0; in_array && i < array_cnt; i++) {
            code += "[_idx" + NumToString(i) + "-1]";
          }
          code += ")\n";
        }
      }
    }
  }